

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O1

Var Js::GlobalObject::VEval
              (JavascriptLibrary *library,FrameDisplay *environment,ModuleID moduleID,
              bool strictMode,bool isIndirect,Arguments *args,bool isLibraryCode,
              bool registerDocument,uint32 additionalGrfscr,ScriptContext *debugEvalScriptContext)

{
  byte bVar1;
  ScriptContext *this;
  Type p_Var2;
  Utf8SourceInfo *pUVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  charcount_t sourceLen;
  int iVar8;
  charcount_t cVar9;
  BOOL BVar10;
  uint32 bodyCtrId;
  undefined4 *puVar11;
  RecyclableObject *aValue;
  JavascriptString *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Var aValue_00;
  ParseableFunctionInfo *pfi;
  FunctionBody *pFVar12;
  TopLevelEvalFunctionBodyResolveInfo *pTVar13;
  FunctionProxy *this_01;
  GlobalObject *this_02;
  uint isIndirect_00;
  uint uVar14;
  undefined1 local_b0 [8];
  FastEvalMapString key;
  Var varThis;
  GlobalObject *local_40;
  ScriptFunction *pfuncScript;
  
  isIndirect_00 = (uint)isIndirect;
  if (library == (JavascriptLibrary *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x22b,"(library)","library");
    if (!bVar5) goto LAB_00b599c7;
    *puVar11 = 0;
  }
  this = (library->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar14 = *(uint *)&args->Info & 0xffffff;
  if (uVar14 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x230,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar5) {
LAB_00b599c7:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar11 = 0;
  }
  aValue = (library->super_JavascriptLibraryBase).undefinedValue.ptr;
  if (1 < uVar14) {
    key._32_8_ = aValue;
    aValue = (RecyclableObject *)Arguments::operator[](args,1);
    bVar5 = VarIs<Js::JavascriptString>(aValue);
    if (bVar5) {
      if (this->transitionToDebugModeIfFirstSourceFn != (TransitionToDebugModeIfFirstSourceFn)0x0) {
        (*this->transitionToDebugModeIfFirstSourceFn)(this,(Utf8SourceInfo *)0x0);
      }
      local_40 = (GlobalObject *)0x0;
      this_00 = VarTo<Js::JavascriptString>(aValue);
      iVar7 = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(this_00);
      sourceLen = JavascriptString::GetLength(this_00);
      pfuncScript._7_1_ = isLibraryCode;
      EvalMapStringInternal<true>::EvalMapStringInternal
                ((EvalMapStringInternal<true> *)local_b0,(FinalizableObject *)this_00,
                 (char16 *)CONCAT44(extraout_var,iVar7),sourceLen,moduleID,(uint)strictMode,
                 (uint)isLibraryCode);
      bVar5 = (this_00->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject !=
              (_func_int **)VirtualTableInfo<Js::PropertyString>::Address;
      if (debugEvalScriptContext == (ScriptContext *)0x0 && bVar5) {
        bVar6 = ScriptContext::IsInEvalMap
                          (this,(FastEvalMapString *)local_b0,isIndirect_00,
                           (ScriptFunction **)&local_40);
      }
      else {
        bVar6 = false;
      }
      if ((bVar6 == false) ||
         ((!isIndirect &&
          ((local_40->super_RootObjectBase).loadMethodInlineCacheMap.ptr !=
           (BaseDictionary<const_Js::PropertyRecord_*,_Js::RootObjectInlineCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            *)&NullFrameDisplay)))) {
        p_Var2 = ((library->super_JavascriptLibraryBase).globalObject.ptr)->EvalHelper;
        iVar8 = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(this_00);
        cVar9 = JavascriptString::GetLength(this_00);
        local_40 = (GlobalObject *)
                   (*p_Var2)(this,(char16_t *)CONCAT44(extraout_var_00,iVar8),cVar9,moduleID,
                             (uint)isLibraryCode * 0x20000 + (additionalGrfscr >> 0x12 & 0x10) +
                             0x1c02 ^ 0x10 | additionalGrfscr,L"eval code",
                             (uint)(byte)(~isLibraryCode & registerDocument),isIndirect_00,
                             (uint)strictMode);
        if (debugEvalScriptContext != (ScriptContext *)0x0) {
          BVar10 = CrossSite::NeedMarshalVar(local_40,debugEvalScriptContext);
          if (BVar10 != 0) {
            aValue_00 = CrossSite::MarshalVar(debugEvalScriptContext,local_40,false);
            local_40 = (GlobalObject *)VarTo<Js::ScriptFunction>(aValue_00);
          }
        }
        if ((debugEvalScriptContext == (ScriptContext *)0x0 && bVar5) && bVar6 == false) {
          ScriptContext::AddToEvalMap
                    (this,(FastEvalMapString *)local_b0,isIndirect_00,(ScriptFunction *)local_40);
        }
      }
      else {
        pFVar12 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_40);
        pUVar3 = (pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
        bVar5 = ScriptContext::IsScriptContextInDebugMode(this);
        if ((bVar5) &&
           ((bVar1 = pUVar3->field_0xa8, (bVar1 & 4) == 0 &&
            (((bVar1 & 0x40) == 0 ||
             ((bVar1 & 0x20) == 0 && (pUVar3->debugModeSource).ptr == (uchar *)0x0)))))) {
          Throw::FatalInternalError(-0x7fffbffb);
        }
      }
      pfuncScript._7_1_ = pfuncScript._7_1_ | local_40 == (GlobalObject *)0x0;
      if ((pfuncScript._7_1_ == 0) &&
         ((this->TTDRecordModeEnabled != false || (this->TTDShouldPerformReplayAction == true)))) {
        pfi = JavascriptFunction::GetParseableFunctionInfo((JavascriptFunction *)local_40);
        pFVar12 = TTD::JsSupport::ForceAndGetFunctionBody(pfi);
        bVar5 = TTD::ScriptContextTTD::IsBodyAlreadyLoadedAtTopLevel(this->TTDContextInfo,pFVar12);
        if (!bVar5) {
          bodyCtrId = 0;
          if (this->TTDRecordModeEnabled == true) {
            pTVar13 = TTD::EventLog::AddEvalFunction
                                (this->threadContext->TTDLog,pFVar12,moduleID,
                                 (char16 *)CONCAT44(extraout_var,iVar7),sourceLen,additionalGrfscr,
                                 registerDocument,isIndirect_00,(uint)strictMode);
            if (this->TTDShouldPerformRecordAction == true) {
              TTD::EventLog::RecordTopLevelCodeAction
                        (this->threadContext->TTDLog,(pTVar13->TopLevelBase).TopLevelBodyCtr);
            }
            bodyCtrId = (pTVar13->TopLevelBase).TopLevelBodyCtr;
          }
          if (this->TTDShouldPerformReplayAction == true) {
            bodyCtrId = TTD::EventLog::ReplayTopLevelCodeAction(this->threadContext->TTDLog);
          }
          TTD::ScriptContextTTD::ProcessFunctionBodyOnLoad
                    (this->TTDContextInfo,pFVar12,(FunctionBody *)0x0);
          TTD::ScriptContextTTD::RegisterEvalScript(this->TTDContextInfo,pFVar12,bodyCtrId);
          if (this->TTDShouldPerformRecordOrReplayAction == true) {
            ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
            m_sourceInfoId = bodyCtrId;
          }
          if (this->TTDShouldPerformReplayDebuggerAction == true) {
            TTD::ExecutionInfoManager::ProcessScriptLoad
                      (this->threadContext->TTDExecutionInfo,this,bodyCtrId,pFVar12,
                       (pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.
                       ptr,(CompileScriptException *)0x0);
          }
        }
      }
      if (DAT_015b5fab == '\x01') {
        this_01 = ScriptFunction::GetFunctionProxy((ScriptFunction *)local_40);
        FunctionProxy::EnsureDeserialized(this_01);
      }
      this_02 = local_40;
      bVar5 = ScriptFunction::HasSuperReference((ScriptFunction *)local_40);
      if ((bVar5) && (((args->Info).field_0x3 & 8) == 0)) {
        JavascriptError::ThrowSyntaxError(this,-0x7ff5fbdc,L"super");
      }
      aValue = (RecyclableObject *)
               ExecuteEvalParsedFunction
                         (this_02,(ScriptFunction *)local_40,environment,(Var *)&key.strict,this);
    }
  }
  return aValue;
}

Assistant:

Var GlobalObject::VEval(JavascriptLibrary* library, FrameDisplay* environment, ModuleID moduleID, bool strictMode, bool isIndirect,
        Arguments& args, bool isLibraryCode, bool registerDocument, uint32 additionalGrfscr, ScriptContext* debugEvalScriptContext)
    {
        Assert(library);
        ScriptContext* scriptContext = library->GetScriptContext();

        unsigned argCount = args.Info.Count;

        AssertMsg(argCount > 0, "Should always have implicit 'this'");

        bool doRegisterDocument = registerDocument & !isLibraryCode;
        Var varThis = library->GetUndefined();

        if (argCount < 2)
        {
            return library->GetUndefined();
        }

        Var evalArg = args[1];
        if (!VarIs<JavascriptString>(evalArg))
        {
            // "If x is not a string value, return x."
            return evalArg;
        }

#ifdef ENABLE_SCRIPT_DEBUGGING
        // It might happen that no script parsed on this context (scriptContext) till now,
        // so this Eval acts as the first source compile for scriptContext, transition to debugMode as needed
        scriptContext->TransitionToDebugModeIfFirstSource(/* utf8SourceInfo = */ nullptr);
#endif

        ScriptFunction *pfuncScript = nullptr;
        JavascriptString *argString = VarTo<JavascriptString>(evalArg);
        char16 const * sourceString = argString->GetSz();
        charcount_t sourceLen = argString->GetLength();
        FastEvalMapString key(argString, sourceString, sourceLen, moduleID, strictMode, isLibraryCode);


        // PropertyString's buffer references to PropertyRecord's inline buffer, if both PropertyString and PropertyRecord are collected
        // we'll leave the PropertyRecord's interior buffer pointer in the EvalMap. So do not use evalmap if we are evaluating PropertyString
        bool useEvalMap = !VirtualTableInfo<PropertyString>::HasVirtualTable(argString) && debugEvalScriptContext == nullptr; // Don't use the cache in case of debugEval

        bool found = useEvalMap && scriptContext->IsInEvalMap(key, isIndirect, &pfuncScript);
        if (!found || (!isIndirect && pfuncScript->GetEnvironment() != &NullFrameDisplay))
        {
            uint32 grfscr = additionalGrfscr | fscrReturnExpression | fscrEval | fscrEvalCode | fscrGlobalCode;

            if (isLibraryCode)
            {
                grfscr |= fscrIsLibraryCode;
            }

            if (!(grfscr & fscrConsoleScopeEval))
            {
                grfscr |= fscrCanDeferFncParse;
            }

            pfuncScript = library->GetGlobalObject()->EvalHelper(scriptContext, argString->GetSz(), argString->GetLength(), moduleID,
                grfscr, Constants::EvalCode, doRegisterDocument, isIndirect, strictMode);

            if (debugEvalScriptContext != nullptr && CrossSite::NeedMarshalVar(pfuncScript, debugEvalScriptContext))
            {
                // This is console scope scenario. DebugEval script context is on the top of the stack. But we are going
                // to execute the user script from target script context. In order to fix the script context stack we
                // need to marshall the function object.
                pfuncScript = VarTo<ScriptFunction>(CrossSite::MarshalVar(debugEvalScriptContext, pfuncScript));
            }

            if (useEvalMap && !found)
            {
                scriptContext->AddToEvalMap(key, isIndirect, pfuncScript);
            }
        }
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        else
        {
            Js::Utf8SourceInfo* utf8SourceInfo = pfuncScript->GetFunctionBody()->GetUtf8SourceInfo();
            if (scriptContext->IsScriptContextInDebugMode() && !utf8SourceInfo->GetIsLibraryCode() && !utf8SourceInfo->IsInDebugMode())
            {
                // Identifying if any non library function escaped for not being in debug mode.
                Throw::FatalInternalError();
            }
        }
#endif

#if ENABLE_TTD
        //
        //TODO: We may (probably?) want to use the debugger source rundown functionality here instead
        //
        if(!isLibraryCode && pfuncScript != nullptr && (scriptContext->IsTTDRecordModeEnabled() || scriptContext->ShouldPerformReplayAction()))
        {
            //Make sure we have the body and text information available
            FunctionBody* globalBody = TTD::JsSupport::ForceAndGetFunctionBody(pfuncScript->GetParseableFunctionInfo());
            if(!scriptContext->TTDContextInfo->IsBodyAlreadyLoadedAtTopLevel(globalBody))
            {
                uint32 bodyIdCtr = 0;

                if(scriptContext->IsTTDRecordModeEnabled())
                {
                    const TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo* tbfi = scriptContext->GetThreadContext()->TTDLog->AddEvalFunction(globalBody, moduleID, sourceString, sourceLen, additionalGrfscr, registerDocument, isIndirect, strictMode);

                    //We always want to register the top-level load but we don't always need to log the event
                    if(scriptContext->ShouldPerformRecordAction())
                    {
                        scriptContext->GetThreadContext()->TTDLog->RecordTopLevelCodeAction(tbfi->TopLevelBase.TopLevelBodyCtr);
                    }

                    bodyIdCtr = tbfi->TopLevelBase.TopLevelBodyCtr;
                }

                if(scriptContext->ShouldPerformReplayAction())
                {
                    bodyIdCtr = scriptContext->GetThreadContext()->TTDLog->ReplayTopLevelCodeAction();
                }

                //walk global body to (1) add functions to pin set (2) build parent map
                scriptContext->TTDContextInfo->ProcessFunctionBodyOnLoad(globalBody, nullptr);
                scriptContext->TTDContextInfo->RegisterEvalScript(globalBody, bodyIdCtr);

                if(scriptContext->ShouldPerformRecordOrReplayAction())
                {
                    globalBody->GetUtf8SourceInfo()->SetSourceInfoForDebugReplay_TTD(bodyIdCtr);
                }

                if(scriptContext->ShouldPerformReplayDebuggerAction())
                {
                    scriptContext->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad(scriptContext, bodyIdCtr, globalBody, globalBody->GetUtf8SourceInfo(), nullptr);
                }
            }
        }
#endif

        //We shouldn't be serializing eval functions; unless with -ForceSerialized flag
        if (CONFIG_FLAG(ForceSerialized)) {
            pfuncScript->GetFunctionProxy()->EnsureDeserialized();
        }

        if (pfuncScript->HasSuperReference())
        {
            // Indirect evals cannot have a super reference.
            if (!(args.Info.Flags & CallFlags_ExtraArg))
            {
                JavascriptError::ThrowSyntaxError(scriptContext, ERRSuperInIndirectEval, _u("super"));
            }
        }

        return library->GetGlobalObject()->ExecuteEvalParsedFunction(pfuncScript, environment, varThis, scriptContext);
    }